

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::DeleteString
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pString)

{
  iterator iVar1;
  bool bVar2;
  pointer pEVar3;
  const_iterator local_30;
  _Self local_28;
  _Self local_20;
  iterator i;
  char *a_pString_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  if ((a_pString < this->m_pData) || (this->m_pData + this->m_uDataLen <= a_pString)) {
    i._M_node = (_List_node_base *)a_pString;
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
         ::begin(&this->m_strings);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           ::end(&this->m_strings);
      bVar2 = std::operator!=(&local_20,&local_28);
      iVar1 = i;
      if (!bVar2) break;
      pEVar3 = std::
               _List_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
               ::operator->(&local_20);
      if (iVar1._M_node == (_List_node_base *)pEVar3->pItem) {
        pEVar3 = std::
                 _List_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                 ::operator->(&local_20);
        if (pEVar3->pItem != (char *)0x0) {
          operator_delete__(pEVar3->pItem);
        }
        std::
        _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
        ::_List_const_iterator(&local_30,&local_20);
        std::__cxx11::
        list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ::erase(&this->m_strings,local_30);
        return;
      }
      std::_List_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::DeleteString(const SI_CHAR *a_pString) {
	// strings may exist either inside the data block, or they will be
	// individually allocated and stored in m_strings. We only physically
	// delete those stored in m_strings.
	if (a_pString < m_pData || a_pString >= m_pData + m_uDataLen) {
		typename TNamesDepend::iterator i = m_strings.begin();
		for (; i != m_strings.end(); ++i) {
			if (a_pString == i->pItem) {
				delete[] const_cast<SI_CHAR *>(i->pItem);
				m_strings.erase(i);
				break;
			}
		}
	}
}